

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Vector<float,_3>_>::genFixeds
          (DefaultSampling<tcu::Vector<float,_3>_> *this,FloatFormat *fmt,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *dst)

{
  ulong uVar1;
  vector<float,_std::allocator<float>_> scalars;
  vector<float,_std::allocator<float>_> local_48;
  Vector<float,_3> local_24;
  
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_48);
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar1 = 0;
    do {
      local_24.m_data[0] =
           local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1];
      local_24.m_data[1] = local_24.m_data[0];
      local_24.m_data[2] = local_24.m_data[0];
      std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
      emplace_back<tcu::Vector<float,3>>
                ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)dst,&local_24)
      ;
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)local_48.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_48.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));
	}